

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::initFromF80LongDoubleAPInt(IEEEFloat *this,APInt *api)

{
  uint64_t uVar1;
  ulong uVar2;
  uint uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  integerPart *piVar6;
  uint8_t myintegerbit;
  uint64_t mysignificand;
  uint64_t myexponent;
  uint64_t i2;
  uint64_t i1;
  APInt *api_local;
  IEEEFloat *this_local;
  
  uVar3 = APInt::getBitWidth(api);
  if (uVar3 != 0x50) {
    __assert_fail("api.getBitWidth()==80",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xbe1,"void llvm::detail::IEEEFloat::initFromF80LongDoubleAPInt(const APInt &)");
  }
  puVar4 = APInt::getRawData(api);
  uVar1 = *puVar4;
  puVar4 = APInt::getRawData(api);
  uVar2 = puVar4[1];
  uVar5 = uVar2 & 0x7fff;
  initialize(this,(fltSemantics *)semX87DoubleExtended);
  uVar3 = partCount(this);
  if (uVar3 != 2) {
    __assert_fail("partCount()==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xbe9,"void llvm::detail::IEEEFloat::initFromF80LongDoubleAPInt(const APInt &)");
  }
  this->field_0x12 = this->field_0x12 & 0xf7 | ((byte)(uVar2 >> 0xf) & 1) << 3;
  if ((uVar5 == 0) && (uVar1 == 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 3;
  }
  else if ((uVar5 == 0x7fff) && (uVar1 == 0x8000000000000000)) {
    this->field_0x12 = this->field_0x12 & 0xf8;
  }
  else if (((uVar5 == 0x7fff) && (uVar1 != 0x8000000000000000)) ||
          ((uVar5 != 0x7fff && ((uVar5 != 0 && (-1 < (long)uVar1)))))) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 1;
    piVar6 = significandParts(this);
    *piVar6 = uVar1;
    piVar6 = significandParts(this);
    piVar6[1] = 0;
  }
  else {
    this->field_0x12 = this->field_0x12 & 0xf8 | 2;
    this->exponent = (short)uVar5 + -0x3fff;
    piVar6 = significandParts(this);
    *piVar6 = uVar1;
    piVar6 = significandParts(this);
    piVar6[1] = 0;
    if (uVar5 == 0) {
      this->exponent = -0x3ffe;
    }
  }
  return;
}

Assistant:

void IEEEFloat::initFromF80LongDoubleAPInt(const APInt &api) {
  assert(api.getBitWidth()==80);
  uint64_t i1 = api.getRawData()[0];
  uint64_t i2 = api.getRawData()[1];
  uint64_t myexponent = (i2 & 0x7fff);
  uint64_t mysignificand = i1;
  uint8_t myintegerbit = mysignificand >> 63;

  initialize(&semX87DoubleExtended);
  assert(partCount()==2);

  sign = static_cast<unsigned int>(i2>>15);
  if (myexponent == 0 && mysignificand == 0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x7fff && mysignificand==0x8000000000000000ULL) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if ((myexponent == 0x7fff && mysignificand != 0x8000000000000000ULL) ||
             (myexponent != 0x7fff && myexponent != 0 && myintegerbit == 0)) {
    // exponent meaningless
    category = fcNaN;
    significandParts()[0] = mysignificand;
    significandParts()[1] = 0;
  } else {
    category = fcNormal;
    exponent = myexponent - 16383;
    significandParts()[0] = mysignificand;
    significandParts()[1] = 0;
    if (myexponent==0)          // denormal
      exponent = -16382;
  }
}